

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O0

RefAST __thiscall ASTFactory::dupTree(ASTFactory *this,AST *t)

{
  AST *this_00;
  AST *c;
  long in_RDX;
  int in_ESI;
  ASTFactory *in_RDI;
  AST *unaff_retaddr;
  ASTFactory *in_stack_00000008;
  RefAST *result;
  AST *in_stack_ffffffffffffff98;
  RefCount local_40 [39];
  undefined1 local_19;
  long local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  dup(in_RDI,in_ESI);
  if (local_18 != 0) {
    this_00 = RefCount<AST>::operator->((RefCount<AST> *)in_RDI);
    AST::getFirstChild(in_stack_ffffffffffffff98);
    c = RefCount::operator_cast_to_AST_(local_40);
    dupList(in_stack_00000008,unaff_retaddr);
    AST::setFirstChild(this_00,&c->down);
    RefCount<AST>::~RefCount(&this_00->down);
    RefCount<AST>::~RefCount(&this_00->down);
  }
  return (RefAST)(Ref *)in_RDI;
}

Assistant:

RefAST ASTFactory::dupTree(const AST* t)
{
	RefAST result = dup(t);		// make copy of root
	// copy all children of root.
	if (t) {
		result->setFirstChild( dupList(t->getFirstChild()) );
	}
	return result;
}